

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

CheckedError __thiscall flatbuffers::Parser::ParseProtoCurliesOrIdent(Parser *this)

{
  bool bVar1;
  Parser *in_RSI;
  int local_34;
  int nesting;
  Parser *this_local;
  CheckedError *ce;
  
  bVar1 = Is(in_RSI,0x7b);
  if (bVar1) {
    Next(this);
    bVar1 = CheckedError::Check((CheckedError *)this);
    if (bVar1) goto LAB_0012e4e3;
    CheckedError::~CheckedError((CheckedError *)this);
    local_34 = 1;
    while (local_34 != 0) {
      if ((in_RSI->super_ParserState).token_ == 0x7b) {
        local_34 = local_34 + 1;
      }
      else if ((in_RSI->super_ParserState).token_ == 0x7d) {
        local_34 = local_34 + -1;
      }
      Next(this);
      bVar1 = CheckedError::Check((CheckedError *)this);
      if (bVar1) goto LAB_0012e4e3;
      CheckedError::~CheckedError((CheckedError *)this);
    }
  }
  else {
    Next(this);
    bVar1 = CheckedError::Check((CheckedError *)this);
    if (bVar1) goto LAB_0012e4e3;
    CheckedError::~CheckedError((CheckedError *)this);
  }
  anon_unknown_0::NoError();
LAB_0012e4e3:
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseProtoCurliesOrIdent() {
  if (Is('{')) {
    NEXT();
    for (int nesting = 1; nesting;) {
      if (token_ == '{')
        nesting++;
      else if (token_ == '}')
        nesting--;
      NEXT();
    }
  } else {
    NEXT();  // Any single token.
  }
  return NoError();
}